

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

qreal __thiscall QEasingCurve::valueForProgress(QEasingCurve *this,qreal progress)

{
  long lVar1;
  double *pdVar2;
  double *in_RDI;
  long in_FS_OFFSET;
  double *in_stack_ffffffffffffffc0;
  double local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pdVar2 = qBound<double>(in_RDI,in_RDI,in_stack_ffffffffffffffc0);
  local_28 = *pdVar2;
  if (*(long *)((long)*in_RDI + 0x10) == 0) {
    if (*(long *)((long)*in_RDI + 8) != 0) {
      local_28 = (double)(**(code **)(**(long **)((long)*in_RDI + 8) + 0x10))(local_28);
    }
  }
  else {
    local_28 = (double)(**(code **)((long)*in_RDI + 0x10))(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

qreal QEasingCurve::valueForProgress(qreal progress) const
{
    progress = qBound<qreal>(0, progress, 1);
    if (d_ptr->func)
        return d_ptr->func(progress);
    else if (d_ptr->config)
        return d_ptr->config->value(progress);
    else
        return progress;
}